

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

size_t __thiscall pbrt::Scene::saveTo(Scene *this,ostream *outStream)

{
  BinaryWriter *this_00;
  BinaryWriter *in_RDI;
  SP sp;
  BinaryWriter binary;
  enable_shared_from_this<pbrt::Entity> *in_stack_fffffffffffffef8;
  shared_ptr<pbrt::Entity> *in_stack_ffffffffffffff00;
  ostream *in_stack_ffffffffffffff18;
  undefined8 local_d8;
  SP *in_stack_ffffffffffffff30;
  BinaryWriter *in_stack_ffffffffffffff38;
  
  BinaryWriter::BinaryWriter(in_RDI,in_stack_ffffffffffffff18);
  std::enable_shared_from_this<pbrt::Entity>::shared_from_this(in_stack_fffffffffffffef8);
  std::shared_ptr<pbrt::Entity>::shared_ptr
            (in_stack_ffffffffffffff00,(shared_ptr<pbrt::Entity> *)in_stack_fffffffffffffef8);
  BinaryWriter::serialize(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x12b54a);
  local_d8 = std::ostream::tellp();
  this_00 = (BinaryWriter *)std::fpos::operator_cast_to_long((fpos *)&local_d8);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x12b592);
  BinaryWriter::~BinaryWriter(this_00);
  return (size_t)this_00;
}

Assistant:

size_t Scene::saveTo(std::ostream &outStream)
  {
    BinaryWriter binary(outStream);
    Entity::SP sp = shared_from_this();
    binary.serialize(sp);
    return binary.binStream.tellp();
  }